

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jmemmgr.c
# Opt level: O0

jvirt_sarray_ptr
request_virt_sarray(j_common_ptr cinfo,int pool_id,boolean pre_zero,JDIMENSION samplesperrow,
                   JDIMENSION numrows,JDIMENSION maxaccess)

{
  long lVar1;
  jvirt_sarray_ptr pjVar2;
  JDIMENSION in_ECX;
  boolean in_EDX;
  int in_ESI;
  long *in_RDI;
  JDIMENSION in_R8D;
  JDIMENSION in_R9D;
  size_t unaff_retaddr;
  jvirt_sarray_ptr result;
  my_mem_ptr mem;
  
  lVar1 = in_RDI[1];
  if (in_ESI != 1) {
    *(undefined4 *)(*in_RDI + 0x28) = 0xf;
    *(int *)(*in_RDI + 0x2c) = in_ESI;
    (**(code **)*in_RDI)(in_RDI);
  }
  pjVar2 = (jvirt_sarray_ptr)alloc_small((j_common_ptr)mem,result._4_4_,unaff_retaddr);
  pjVar2->mem_buffer = (JSAMPARRAY)0x0;
  pjVar2->rows_in_array = in_R8D;
  pjVar2->samplesperrow = in_ECX;
  pjVar2->maxaccess = in_R9D;
  pjVar2->pre_zero = in_EDX;
  pjVar2->b_s_open = 0;
  pjVar2->next = *(jvirt_sarray_ptr *)(lVar1 + 0x88);
  *(jvirt_sarray_ptr *)(lVar1 + 0x88) = pjVar2;
  return pjVar2;
}

Assistant:

METHODDEF(jvirt_sarray_ptr)
request_virt_sarray (j_common_ptr cinfo, int pool_id, boolean pre_zero,
		     JDIMENSION samplesperrow, JDIMENSION numrows,
		     JDIMENSION maxaccess)
/* Request a virtual 2-D sample array */
{
  my_mem_ptr mem = (my_mem_ptr) cinfo->mem;
  jvirt_sarray_ptr result;

  /* Only IMAGE-lifetime virtual arrays are currently supported */
  if (pool_id != JPOOL_IMAGE)
    ERREXIT1(cinfo, JERR_BAD_POOL_ID, pool_id);	/* safety check */

  /* get control block */
  result = (jvirt_sarray_ptr) alloc_small(cinfo, pool_id,
					  SIZEOF(struct jvirt_sarray_control));

  result->mem_buffer = NULL;	/* marks array not yet realized */
  result->rows_in_array = numrows;
  result->samplesperrow = samplesperrow;
  result->maxaccess = maxaccess;
  result->pre_zero = pre_zero;
  result->b_s_open = FALSE;	/* no associated backing-store object */
  result->next = mem->virt_sarray_list; /* add to list of virtual arrays */
  mem->virt_sarray_list = result;

  return result;
}